

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O2

double inform_relative_entropy(int *xs,int *ys,size_t n,int b,inform_error *err)

{
  inform_dist *p;
  inform_dist *q;
  _Bool _Var1;
  inform_dist *x;
  inform_dist *y;
  inform_dist *local_48;
  double local_40;
  inform_dist *local_38;
  
  _Var1 = check_arguments(xs,ys,n,b,err);
  if (!_Var1) {
    local_48 = (inform_dist *)0x0;
    local_38 = (inform_dist *)0x0;
    _Var1 = allocate(b,&local_48,&local_38,err);
    q = local_38;
    p = local_48;
    if (!_Var1) {
      accumulate(xs,ys,n,local_48,local_38);
      local_40 = inform_shannon_re(p,q,2.0);
      free_all(&local_48,&local_38);
      return local_40;
    }
  }
  return NAN;
}

Assistant:

double inform_relative_entropy(int const *xs, int const *ys, size_t n, int b,
    inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NAN;

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err)) return NAN;

    accumulate(xs, ys, n, x, y);

    double re = inform_shannon_re(x, y, 2.0);

    free_all(&x, &y);

    return re;
}